

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O0

int anon_unknown.dwarf_364d1::xFullPathname(sqlite3_vfs *param_1,char *zName,int nOut,char *zOut)

{
  int i;
  char *zOut_local;
  int nOut_local;
  char *zName_local;
  sqlite3_vfs *param_0_local;
  int local_4;
  
  if (zName == (char *)0x0) {
    local_4 = 1;
  }
  else {
    for (i = 0; zName[i] != '\0' && i < nOut; i = i + 1) {
      zOut[i] = zName[i];
    }
    if (i < nOut) {
      zOut[i] = '\0';
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int xFullPathname(sqlite3_vfs *, const char *zName, int nOut, char *zOut)
{
    if (!zName)
        return SQLITE_ERROR;

    int i = 0;
    for (;zName[i] && i < nOut; ++i)
        zOut[i] = zName[i];

    if (i >= nOut)
        return SQLITE_ERROR;

    zOut[i] = '\0';
    return SQLITE_OK;
}